

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O1

int uv__loop_configure(uv_loop_t *loop,uv_loop_option option,__va_list_tag *ap)

{
  uint uVar1;
  int *local_48;
  uv__loop_internal_fields_t *lfields;
  __va_list_tag *ap_local;
  uv_loop_option option_local;
  uv_loop_t *loop_local;
  
  if (option == UV_METRICS_IDLE_TIME) {
    *(uint *)loop->internal_fields = *loop->internal_fields | 1;
    loop_local._4_4_ = 0;
  }
  else if (option == UV_LOOP_BLOCK_SIGNAL) {
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_48 = (int *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_48 = (int *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_48 + 2;
    }
    if (*local_48 == 0x1b) {
      loop->flags = loop->flags | 1;
      loop_local._4_4_ = 0;
    }
    else {
      loop_local._4_4_ = -0x16;
    }
  }
  else {
    loop_local._4_4_ = -0x26;
  }
  return loop_local._4_4_;
}

Assistant:

int uv__loop_configure(uv_loop_t* loop, uv_loop_option option, va_list ap) {
  uv__loop_internal_fields_t* lfields;

  lfields = uv__get_internal_fields(loop);
  if (option == UV_METRICS_IDLE_TIME) {
    lfields->flags |= UV_METRICS_IDLE_TIME;
    return 0;
  }

  if (option != UV_LOOP_BLOCK_SIGNAL)
    return UV_ENOSYS;

  if (va_arg(ap, int) != SIGPROF)
    return UV_EINVAL;

  loop->flags |= UV_LOOP_BLOCK_SIGPROF;
  return 0;
}